

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_ticket.c
# Opt level: O1

void mbedtls_ssl_ticket_free(mbedtls_ssl_ticket_context *ctx)

{
  long lVar1;
  
  mbedtls_cipher_free(&ctx->keys[0].ctx);
  mbedtls_cipher_free(&ctx->keys[1].ctx);
  lVar1 = 0;
  do {
    ctx->keys[0].name[lVar1] = '\0';
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0xd8);
  return;
}

Assistant:

void mbedtls_ssl_ticket_free( mbedtls_ssl_ticket_context *ctx )
{
    mbedtls_cipher_free( &ctx->keys[0].ctx );
    mbedtls_cipher_free( &ctx->keys[1].ctx );

#if defined(MBEDTLS_THREADING_C)
    mbedtls_mutex_free( &ctx->mutex );
#endif

    mbedtls_zeroize( ctx, sizeof( mbedtls_ssl_ticket_context ) );
}